

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::DecommitNow(PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
              *this,bool all)

{
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *this_00;
  uint uVar1;
  undefined4 *puVar2;
  HANDLE pVVar3;
  CriticalSection *pCVar4;
  code *pcVar5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  DWORD DVar9;
  FreePageEntry *__s;
  ThreadContextId pvVar10;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *pDVar11;
  HANDLE pVVar12;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *pPVar13;
  size_t sVar14;
  ulong uVar15;
  char16_t *form;
  long lVar16;
  ulong uVar17;
  undefined8 *in_FS_OFFSET;
  long local_58;
  AutoCriticalSection local_50;
  AutoCriticalSection autoCS;
  
  iVar8 = (*this->_vptr_PageAllocatorBase[3])();
  if ((char)iVar8 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x797,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar6) goto LAB_0027bd47;
    *puVar2 = 0;
  }
  if ((Js::Configuration::Global[0x2c158] == '\x01') && (bVar6 = HasZeroPageQueue(this), bVar6)) {
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    local_58 = 0;
LAB_0027b01f:
    do {
      __s = PopPendingZeroPage(this);
      if (__s == (FreePageEntry *)0x0) goto LAB_0027b263;
      if (this->waitingToEnterIdleDecommit != false) goto LAB_0027b2d9;
      bVar6 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
      if (bVar6) {
        pvVar10 = JsUtil::ExternalApi::GetCurrentThreadContextId();
        DVar9 = GetCurrentThreadId();
        Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar10,(ulong)DVar9,this);
        if (this->debugName != (char16 *)0x0) {
          Output::Print(L"[%s] ");
        }
        Output::Print(L"Freeing page from zero queue","");
        Output::Print(L"\n");
        bVar6 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
        if (bVar6) {
          (*this->_vptr_PageAllocatorBase[5])(this);
        }
        Output::Flush();
      }
      pPVar13 = __s->segment;
      uVar1 = __s->pageCount;
      uVar17 = (ulong)uVar1;
      pDVar11 = GetSegmentList(this,pPVar13);
      if (pDVar11 ==
          (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
          0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar2 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x7cb,"(fromSegmentList != nullptr)","fromSegmentList != nullptr");
        if (!bVar6) goto LAB_0027bd47;
        *puVar2 = 0;
      }
      if (all) {
        PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitPages<false>
                  (pPVar13,__s,uVar1);
        LogFreePages(this,uVar17);
        LogDecommitPages(this,uVar17);
        bVar6 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::IsAllDecommitted(pPVar13);
        if (bVar6) {
          LogFreePartiallyDecommittedPageSegment(this,pPVar13);
          DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
          RemoveElement<Memory::NoThrowHeapAllocator>
                    (pDVar11,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance,pPVar13);
          local_58 = local_58 + (ulong)this->maxAllocPageCount;
          goto LAB_0027b01f;
        }
      }
      else {
        pVVar3 = this->processHandle;
        pVVar12 = GetCurrentProcess();
        if (pVVar3 != pVVar12) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar2 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x7e3,"(this->processHandle == GetCurrentProcess())",
                             "this->processHandle == GetCurrentProcess()");
          if (!bVar6) goto LAB_0027bd47;
          *puVar2 = 0;
        }
        memset(__s,0,(ulong)(uVar1 << 0xc));
        PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::ReleasePages(pPVar13,__s,uVar1);
        LogFreePages(this,uVar17);
      }
      TransferSegment(this,pPVar13,pDVar11);
    } while( true );
  }
  local_58 = 0;
  goto LAB_0027b2e1;
LAB_0027b263:
  local_50.cs = &this->backgroundPageQueue->backgroundPageQueueCriticalSection;
  CCLock::Enter(&(local_50.cs)->super_CCLock);
  this->hasZeroQueuedPages = false;
  bVar6 = HasZeroQueuedPages(this);
  if (bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar2 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x7f2,"(!this->HasZeroQueuedPages())","!this->HasZeroQueuedPages()");
    if (!bVar6) goto LAB_0027bd47;
    *puVar2 = 0;
  }
  AutoCriticalSection::~AutoCriticalSection(&stack0xffffffffffffffb0);
LAB_0027b2d9:
  FlushBackgroundPages(this);
LAB_0027b2e1:
  if (this->freePageCount == 0) {
    if (this->debugMinFreePageCount == 0) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x7fc,"(debugMinFreePageCount == 0)","debugMinFreePageCount == 0");
    if (bVar6) {
      *puVar2 = 0;
      return;
    }
    goto LAB_0027bd47;
  }
  bVar6 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
  if (bVar6) {
    pvVar10 = JsUtil::ExternalApi::GetCurrentThreadContextId();
    DVar9 = GetCurrentThreadId();
    Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar10,(ulong)DVar9,this);
    if (this->debugName != (char16 *)0x0) {
      Output::Print(L"[%s] ");
    }
    Output::Print(L"Decommit now","");
    Output::Print(L"\n");
    bVar6 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
    if (bVar6) {
      (*this->_vptr_PageAllocatorBase[5])(this);
    }
    Output::Flush();
  }
  UpdateMinFreePageCount(this);
  if (all) {
    bVar6 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
    if (bVar6) {
      pvVar10 = JsUtil::ExternalApi::GetCurrentThreadContextId();
      DVar9 = GetCurrentThreadId();
      Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar10,(ulong)DVar9,this);
      if (this->debugName != (char16 *)0x0) {
        Output::Print(L"[%s] ");
      }
      form = L"Full decommit";
      uVar15 = 0;
LAB_0027b565:
      Output::Print(form,"");
      Output::Print(L"\n");
      bVar6 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
      if (bVar6) {
        (*this->_vptr_PageAllocatorBase[5])(this);
      }
      Output::Flush();
    }
    else {
      uVar15 = 0;
    }
  }
  else {
    uVar17 = this->freePageCount;
    uVar15 = this->minFreePageCount;
    if (uVar17 < uVar15) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x811,"(this->minFreePageCount <= this->freePageCount)",
                         "this->minFreePageCount <= this->freePageCount");
      if (!bVar6) goto LAB_0027bd47;
      *puVar2 = 0;
      uVar17 = this->freePageCount;
      uVar15 = this->minFreePageCount;
    }
    uVar17 = uVar17 - (uVar15 >> 1);
    uVar15 = 0x1000;
    if (0x1000 < uVar17) {
      uVar15 = uVar17;
    }
    bVar6 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
    if (bVar6) {
      pvVar10 = JsUtil::ExternalApi::GetCurrentThreadContextId();
      DVar9 = GetCurrentThreadId();
      Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar10,(ulong)DVar9,this);
      if (this->debugName != (char16 *)0x0) {
        Output::Print(L"[%s] ");
      }
      form = L"Partial decommit";
      goto LAB_0027b565;
    }
  }
  uVar17 = this->freePageCount - uVar15;
  if (this->freePageCount < uVar15 || uVar17 == 0) {
    bVar6 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
    if (!bVar6) {
      return;
    }
    pvVar10 = JsUtil::ExternalApi::GetCurrentThreadContextId();
    DVar9 = GetCurrentThreadId();
    Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar10,(ulong)DVar9,this);
    if (this->debugName != (char16 *)0x0) {
      Output::Print(L"[%s] ");
    }
    Output::Print(L"No pages to decommit","");
    Output::Print(L"\n");
    bVar6 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
    if (!bVar6) goto LAB_0027bd33;
  }
  else {
    bVar6 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
    if (bVar6) {
      pvVar10 = JsUtil::ExternalApi::GetCurrentThreadContextId();
      DVar9 = GetCurrentThreadId();
      Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar10,(ulong)DVar9,this);
      if (this->debugName != (char16 *)0x0) {
        Output::Print(L"[%s] ");
      }
      Output::Print(L"Decommit page count = %d",uVar17);
      Output::Print(L"\n");
      bVar6 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
      if (bVar6) {
        (*this->_vptr_PageAllocatorBase[5])(this);
      }
      Output::Flush();
    }
    bVar6 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
    if (bVar6) {
      pvVar10 = JsUtil::ExternalApi::GetCurrentThreadContextId();
      DVar9 = GetCurrentThreadId();
      Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar10,(ulong)DVar9,this);
      if (this->debugName != (char16 *)0x0) {
        Output::Print(L"[%s] ");
      }
      Output::Print(L"Free page count = %d",this->freePageCount);
      Output::Print(L"\n");
      bVar6 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
      if (bVar6) {
        (*this->_vptr_PageAllocatorBase[5])(this);
      }
      Output::Flush();
    }
    bVar6 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
    if (bVar6) {
      pvVar10 = JsUtil::ExternalApi::GetCurrentThreadContextId();
      DVar9 = GetCurrentThreadId();
      Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar10,(ulong)DVar9,this);
      if (this->debugName != (char16 *)0x0) {
        Output::Print(L"[%s] ");
      }
      Output::Print(L"New free page count = %d",uVar15);
      Output::Print(L"\n");
      bVar6 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
      if (bVar6) {
        (*this->_vptr_PageAllocatorBase[5])(this);
      }
      Output::Flush();
    }
    pDVar11 = &this->decommitSegments;
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    lVar16 = 0;
    local_50.cs = (CriticalSection *)pDVar11;
    autoCS.cs = (CriticalSection *)pDVar11;
    do {
      if (uVar17 == 0) {
        uVar17 = 0;
        break;
      }
      if (autoCS.cs == (CriticalSection *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar2 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                           ,0x66,"(current != nullptr)","current != nullptr");
        if (!bVar6) goto LAB_0027bd47;
        *puVar2 = 0;
      }
      pCVar4 = *(CriticalSection **)((autoCS.cs)->super_CCLock).mutexPtr;
      if (pCVar4 == local_50.cs) break;
      autoCS.cs = pCVar4;
      pPVar13 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                ::Iterator::Data((Iterator *)&stack0xffffffffffffffb0);
      sVar14 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitFreePages
                         (pPVar13,uVar17);
      LogDecommitPages(this,sVar14);
      pPVar13 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                ::Iterator::Data((Iterator *)&stack0xffffffffffffffb0);
      if (pPVar13->decommitPageCount == this->maxAllocPageCount) {
        pPVar13 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                  ::Iterator::Data((Iterator *)&stack0xffffffffffffffb0);
        LogFreePartiallyDecommittedPageSegment(this,pPVar13);
        DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
        EditingIterator::RemoveCurrent<Memory::NoThrowHeapAllocator>
                  ((EditingIterator *)&stack0xffffffffffffffb0,
                   (NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance);
        local_58 = local_58 + (ulong)this->maxAllocPageCount;
      }
      lVar16 = lVar16 + sVar14;
      uVar17 = uVar17 - sVar14;
    } while (this->waitingToEnterIdleDecommit != true);
    this_00 = &this->emptySegments;
    while (((this->waitingToEnterIdleDecommit == false && (uVar17 != 0)) &&
           ((DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *
            )(this->emptySegments).
             super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>.
             next.base != this_00))) {
      uVar1 = this->maxAllocPageCount;
      pPVar13 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                ::Head(this_00);
      if (uVar17 < uVar1) {
        sVar14 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitFreePages
                           (pPVar13,uVar17);
        LogDecommitPages(this,sVar14);
        if (sVar14 != uVar17) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar2 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x85d,"(pageDecommitted == pageToDecommit)",
                             "pageDecommitted == pageToDecommit");
          if (!bVar6) goto LAB_0027bd47;
          *puVar2 = 0;
        }
        DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
        MoveHeadTo(this_00,pDVar11);
        uVar17 = 0;
      }
      else {
        if (pPVar13->decommitPageCount != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar2 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x84c,"(emptySegments.Head().GetDecommitPageCount() == 0)",
                             "emptySegments.Head().GetDecommitPageCount() == 0");
          if (!bVar6) goto LAB_0027bd47;
          *puVar2 = 0;
        }
        pPVar13 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                  ::Head(this_00);
        LogFreeSegment(this,&pPVar13->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>);
        DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
        RemoveHead<Memory::NoThrowHeapAllocator>
                  (this_00,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance);
        sVar14 = (size_t)this->maxAllocPageCount;
        uVar17 = uVar17 - sVar14;
        local_58 = local_58 + sVar14;
      }
      lVar16 = lVar16 + sVar14;
    }
    if (this->waitingToEnterIdleDecommit == false) {
      local_50.cs = (CriticalSection *)&this->segments;
      autoCS.cs = local_50.cs;
      do {
        if (uVar17 == 0) {
          uVar17 = 0;
          break;
        }
        if (autoCS.cs == (CriticalSection *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar2 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                             ,0x66,"(current != nullptr)","current != nullptr");
          if (!bVar6) goto LAB_0027bd47;
          *puVar2 = 0;
        }
        pCVar4 = *(CriticalSection **)((autoCS.cs)->super_CCLock).mutexPtr;
        if (pCVar4 == local_50.cs) break;
        autoCS.cs = pCVar4;
        pPVar13 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                  ::Iterator::Data((Iterator *)&stack0xffffffffffffffb0);
        sVar14 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitFreePages
                           (pPVar13,uVar17);
        LogDecommitPages(this,sVar14);
        pPVar13 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                  ::Iterator::Data((Iterator *)&stack0xffffffffffffffb0);
        if (pPVar13->decommitPageCount == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar2 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x86e,"(i.Data().GetDecommitPageCount() != 0)",
                             "i.Data().GetDecommitPageCount() != 0");
          if (!bVar6) goto LAB_0027bd47;
          *puVar2 = 0;
        }
        pPVar13 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                  ::Iterator::Data((Iterator *)&stack0xffffffffffffffb0);
        if (this->maxAllocPageCount < pPVar13->decommitPageCount) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar2 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x86f,"(i.Data().GetDecommitPageCount() <= maxAllocPageCount)",
                             "i.Data().GetDecommitPageCount() <= maxAllocPageCount");
          if (!bVar6) goto LAB_0027bd47;
          *puVar2 = 0;
        }
        lVar16 = lVar16 + sVar14;
        DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
        EditingIterator::MoveCurrentTo((EditingIterator *)&stack0xffffffffffffffb0,pDVar11);
        uVar17 = uVar17 - sVar14;
      } while (this->waitingToEnterIdleDecommit != true);
    }
    if (uVar17 != 0) {
      bVar7 = this->waitingToEnterIdleDecommit;
      if ((bool)bVar7 == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar2 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x87b,"(pageToDecommit == 0 || this->waitingToEnterIdleDecommit)",
                           "pageToDecommit == 0 || this->waitingToEnterIdleDecommit");
        if (!bVar6) goto LAB_0027bd47;
        *puVar2 = 0;
        bVar7 = this->waitingToEnterIdleDecommit;
      }
      if ((bVar7 & 1) != 0) {
        this->idleDecommitBackOffCount = this->idleDecommitBackOffCount + 1;
      }
    }
    uVar17 = uVar17 + uVar15;
    if (this->freePageCount != uVar17 + lVar16) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar2 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x884,
                         "(this->freePageCount == newFreePageCount + decommitCount + pageToDecommit)"
                         ,"this->freePageCount == newFreePageCount + decommitCount + pageToDecommit"
                        );
      if (!bVar6) {
LAB_0027bd47:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar2 = 0;
    }
    this->freePageCount = uVar17;
    if (uVar17 < this->debugMinFreePageCount) {
      this->debugMinFreePageCount = uVar17;
    }
    Check(this);
    this->decommitPageCount = this->decommitPageCount + (lVar16 - local_58);
    bVar6 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
    if (!bVar6) {
      return;
    }
    bVar6 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
    if (!bVar6) goto LAB_0027bd33;
    Output::Print(L" After decommit now:\n");
  }
  (*this->_vptr_PageAllocatorBase[5])(this);
LAB_0027bd33:
  Output::Flush();
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::DecommitNow(bool all)
{
    Assert(!this->HasMultiThreadAccess());

#ifdef ENABLE_BASIC_TELEMETRY
    if (this->decommitStats != nullptr)
    {
        this->decommitStats->numDecommitCalls++;
        if (this->decommitStats->lastLeaveDecommitRegion.ToMicroseconds() > 0)
        {
            Js::TickDelta delta = Js::Tick::Now() - this->decommitStats->lastLeaveDecommitRegion;
            if (delta > this->decommitStats->maxDeltaBetweenDecommitRegionLeaveAndDecommit)
            {
                this->decommitStats->maxDeltaBetweenDecommitRegionLeaveAndDecommit = delta;
            }
        }
    }
#endif

    size_t deleteCount = 0;

#if ENABLE_BACKGROUND_PAGE_ZEROING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        // First, drain the zero page queue.
        // This will cause the free page count to be accurate
        if (HasZeroPageQueue())
        {
            int numZeroPagesFreed = 0;

            // There might be queued zero pages.  Drain them first
            bool zeroPageQueueEmpty = false;
            while (true)
            {
                FreePageEntry * freePageEntry = PopPendingZeroPage();
                if (freePageEntry == nullptr)
                {
                    zeroPageQueueEmpty = true;
                    break;
                }

                // Back-off from decommit if we are trying to enter IdleDecommit again.
                if (this->waitingToEnterIdleDecommit)
                {
                    break;
                }

                PAGE_ALLOC_TRACE_AND_STATS_0(_u("Freeing page from zero queue"));
                TPageSegment * segment = freePageEntry->segment;
                uint pageCount = freePageEntry->pageCount;

                numZeroPagesFreed += pageCount;

                DListBase<TPageSegment> * fromSegmentList = GetSegmentList(segment);
                Assert(fromSegmentList != nullptr);

                // Check for all here, since the actual free page count can't be determined
                // until we've flushed the zeroed page queue
                if (all)
                {
                    // Decommit them immediately if we are decommitting all pages.
                    segment->template DecommitPages<false>(freePageEntry, pageCount);
                    LogFreePages(pageCount);
                    LogDecommitPages(pageCount);

                    if (segment->IsAllDecommitted())
                    {
                        LogFreePartiallyDecommittedPageSegment(segment);
                        fromSegmentList->RemoveElement(&NoThrowNoMemProtectHeapAllocator::Instance, segment);

                        deleteCount += maxAllocPageCount;

                        continue;
                    }
                }
                else
                {
                    // Zero them and release them in case we don't decommit them.
                    Assert(this->processHandle == GetCurrentProcess());
                    memset(freePageEntry, 0, pageCount * AutoSystemInfo::PageSize);
                    segment->ReleasePages(freePageEntry, pageCount);
                    LogFreePages(pageCount);
                }

                TransferSegment(segment, fromSegmentList);
            }

            // Take the lock to make sure the recycler thread has finished zeroing out the pages after
            // we drained the queue
            if(zeroPageQueueEmpty)
            {
                AutoCriticalSection autoCS(&backgroundPageQueue->backgroundPageQueueCriticalSection);
                this->hasZeroQueuedPages = false;
                Assert(!this->HasZeroQueuedPages());
            }

            FlushBackgroundPages();
        }
    }
#endif

    if (this->freePageCount == 0)
    {
        Assert(debugMinFreePageCount == 0);
        return;
    }

    PAGE_ALLOC_TRACE_AND_STATS_0(_u("Decommit now"));

    // minFreePageCount is not updated on every page allocate,
    // so we have to do a final update here.
    UpdateMinFreePageCount();

    size_t newFreePageCount;

    if (all)
    {
        newFreePageCount = this->GetFreePageLimit();

        PAGE_ALLOC_TRACE_AND_STATS_0(_u("Full decommit"));
    }
    else
    {
        // Decommit half the min free page count since last partial decommit
        Assert(this->minFreePageCount <= this->freePageCount);
        newFreePageCount = this->freePageCount - (this->minFreePageCount / 2);

        // Ensure we don't decommit down to fewer than our partial decommit minimum
        newFreePageCount = max(newFreePageCount, static_cast<size_t>(MinPartialDecommitFreePageCount));

        PAGE_ALLOC_TRACE_AND_STATS_0(_u("Partial decommit"));
    }

    if (newFreePageCount >= this->freePageCount)
    {
        PAGE_ALLOC_TRACE_AND_STATS_0(_u("No pages to decommit"));
        return;
    }

    size_t pageToDecommit = this->freePageCount - newFreePageCount;

    PAGE_ALLOC_TRACE_AND_STATS(_u("Decommit page count = %d"), pageToDecommit);
    PAGE_ALLOC_TRACE_AND_STATS(_u("Free page count = %d"), this->freePageCount);
    PAGE_ALLOC_TRACE_AND_STATS(_u("New free page count = %d"), newFreePageCount);

    size_t decommitCount = 0;


    // decommit from page that already has other decommitted page already
    {
        typename DListBase<TPageSegment>::EditingIterator i(&decommitSegments);

        while (pageToDecommit > 0  && i.Next())
        {
            size_t pageDecommitted = i.Data().DecommitFreePages(pageToDecommit);
            LogDecommitPages(pageDecommitted);

            decommitCount += pageDecommitted;

            if (i.Data().GetDecommitPageCount() == maxAllocPageCount)
            {
                LogFreePartiallyDecommittedPageSegment(&i.Data());
                i.RemoveCurrent(&NoThrowNoMemProtectHeapAllocator::Instance);

                deleteCount += maxAllocPageCount;

            }
            pageToDecommit -= pageDecommitted;

            // Back-off from decommit if we are trying to enter IdleDecommit again.
            if (this->waitingToEnterIdleDecommit)
            {
                break;
            }
        }
    }

    // decommit pages that are empty.
    // back-off from decommit if we are trying to enter IdleDecommit again.
    while (!this->waitingToEnterIdleDecommit && pageToDecommit > 0 && !emptySegments.Empty())
    {
        if (pageToDecommit >= maxAllocPageCount)
        {
            Assert(emptySegments.Head().GetDecommitPageCount() == 0);
            LogFreeSegment(&emptySegments.Head());
            emptySegments.RemoveHead(&NoThrowNoMemProtectHeapAllocator::Instance);

            pageToDecommit -= maxAllocPageCount;

            decommitCount += maxAllocPageCount;
            deleteCount += maxAllocPageCount;

        }
        else
        {
            size_t pageDecommitted = emptySegments.Head().DecommitFreePages(pageToDecommit);
            LogDecommitPages(pageDecommitted);

            decommitCount += pageDecommitted;

            Assert(pageDecommitted == pageToDecommit);
            emptySegments.MoveHeadTo(&decommitSegments);
            pageToDecommit = 0;
        }
    }

    if(!this->waitingToEnterIdleDecommit)
    {
        typename DListBase<TPageSegment>::EditingIterator i(&segments);

        while (pageToDecommit > 0  && i.Next())
        {
            size_t pageDecommitted = i.Data().DecommitFreePages(pageToDecommit);
            LogDecommitPages(pageDecommitted);

            decommitCount += pageDecommitted;

            Assert(i.Data().GetDecommitPageCount() != 0);
            Assert(i.Data().GetDecommitPageCount() <= maxAllocPageCount);
            i.MoveCurrentTo(&decommitSegments);
            pageToDecommit -= pageDecommitted;

            // Back-off from decommit if we are trying to enter IdleDecommit again.
            if (this->waitingToEnterIdleDecommit)
            {
                break;
            }
        }
    }

    Assert(pageToDecommit == 0 || this->waitingToEnterIdleDecommit);
#if DBG
    if (pageToDecommit != 0 && this->waitingToEnterIdleDecommit)
    {
        this->idleDecommitBackOffCount++;
    }
#endif

#if DBG_DUMP
    Assert(this->freePageCount == newFreePageCount + decommitCount + pageToDecommit);
#endif

    // If we had to back-off from decommiting then we may still have some free pages left to decommit.
    this->freePageCount = newFreePageCount + pageToDecommit;

#ifdef ENABLE_BASIC_TELEMETRY
    if (this->decommitStats != nullptr)
    {
        this->decommitStats->numPagesDecommitted += decommitCount;
        this->decommitStats->numFreePageCount += newFreePageCount + pageToDecommit;
    }
#endif

#if DBG
    UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
    Check();
#endif
#if DBG_DUMP
    this->decommitPageCount += (decommitCount - deleteCount);
    if (CUSTOM_PHASE_TRACE1(this->pageAllocatorFlagTable, Js::PageAllocatorPhase))
    {
        if (CUSTOM_PHASE_STATS1(this->pageAllocatorFlagTable, Js::PageAllocatorPhase))
        {
            Output::Print(_u(" After decommit now:\n"));
            this->DumpStats();
        }
        Output::Flush();
    }
#endif
}